

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O3

void DepParserTask::run(search *sch,multi_ex *ec)

{
  v_array<unsigned_int> *valid_action;
  v_array<std::pair<unsigned_int,_float>_> *gold_action_losses;
  v_array<unsigned_int> *gold_actions;
  uint uVar1;
  undefined8 *puVar2;
  uint n;
  bool bVar3;
  ptag pVar4;
  action aVar5;
  uint32_t t_id;
  action aVar6;
  ptag count;
  predictor *ppVar7;
  stringstream *psVar8;
  ostream *poVar9;
  vw_exception *this;
  size_t i;
  long lVar10;
  ulong uVar11;
  uint32_t uVar12;
  uint64_t stack_depth;
  uint64_t state;
  ptag tag;
  uint32_t right_label;
  uint32_t left_label;
  size_t sVar13;
  ulong uVar14;
  uint idx;
  ulong uVar15;
  float loss;
  predictor P;
  stringstream __msg;
  string local_2c0;
  predictor local_2a0;
  pair<unsigned_int,_float> local_1b8 [2];
  ostream local_1a8;
  
  puVar2 = (undefined8 *)sch->task_data;
  uVar15 = (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  v_array<unsigned_int>::clear((v_array<unsigned_int> *)(puVar2 + 0x13));
  local_1b8[0].first = 1;
  if (puVar2[1] == 0) {
    local_1b8[0].first = (uint)(*(int *)((long)puVar2 + 0x2c4) != 1);
  }
  valid_action = (v_array<unsigned_int> *)(puVar2 + 3);
  gold_action_losses = (v_array<std::pair<unsigned_int,_float>_> *)(puVar2 + 0x2f);
  gold_actions = (v_array<unsigned_int> *)(puVar2 + 0x27);
  v_array<unsigned_int>::push_back((v_array<unsigned_int> *)(puVar2 + 0x13),&local_1b8[0].first);
  n = (uint)uVar15;
  lVar10 = 0;
  do {
    if ((ulong)(n + 1) != 0) {
      uVar11 = 0;
      do {
        *(undefined4 *)(puVar2[lVar10 * 4 + 0x33] + uVar11 * 4) = 0;
        uVar11 = uVar11 + 1;
      } while (n + 1 != uVar11);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  uVar15 = uVar15 & 0xffffffff;
  if (uVar15 != 0) {
    uVar11 = 0;
    do {
      *(undefined4 *)(puVar2[0x17] + 4 + uVar11 * 4) = 9999999;
      *(undefined4 *)(puVar2[0x1b] + 4 + uVar11 * 4) = 9999999;
      uVar11 = uVar11 + 1;
    } while (uVar15 != uVar11);
  }
  sVar13 = 2;
  if (puVar2[1] == 0) {
    sVar13 = (size_t)((*(int *)((long)puVar2 + 0x2c4) != 1) + 1);
  }
  Search::predictor::predictor(&local_2a0,sch,0);
  tag = 1;
LAB_0026d00f:
  do {
    uVar11 = sVar13 & 0xffffffff;
    do {
      idx = (uint)sVar13;
      if (*(int *)((long)puVar2 + 0x2c4) == 2) {
        if ((puVar2[0x14] == puVar2[0x13]) && (n < idx)) goto LAB_0026d59f;
      }
      else if ((*(int *)((long)puVar2 + 0x2c4) == 1) &&
              (((ulong)(puVar2[0x14] - puVar2[0x13]) < 5 && (n < idx)))) {
        *(undefined4 *)(puVar2[0x17] + (ulong)*(uint *)(puVar2[0x14] + -4) * 4) = 0;
        *(undefined4 *)(puVar2[0x1b] + (ulong)*(uint *)(puVar2[0x14] + -4) * 4) =
             *(undefined4 *)(puVar2 + 1);
        if (*(int *)(puVar2[0xb] + (ulong)*(uint *)(puVar2[0x14] + -4) * 4) ==
            *(int *)(puVar2[0x17] + (ulong)*(uint *)(puVar2[0x14] + -4) * 4)) {
          loss = 0.0;
        }
        else {
          loss = 1.0;
        }
        Search::search::loss(sch,loss);
LAB_0026d59f:
        psVar8 = Search::search::output_abi_cxx11_(sch);
        if ((*(int *)(psVar8 + *(long *)(*(long *)psVar8 + -0x18) + 0x20) == 0) && (uVar15 != 0)) {
          uVar11 = 0;
          do {
            psVar8 = Search::search::output_abi_cxx11_(sch);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)(psVar8 + 0x10));
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            uVar11 = uVar11 + 1;
          } while (uVar15 != uVar11);
        }
        Search::predictor::~predictor(&local_2a0);
        return;
      }
      bVar3 = Search::search::predictNeedsExample(sch);
      if (bVar3) {
        extract_features(sch,idx,ec);
      }
      lVar10 = puVar2[0x14] - puVar2[0x13];
      if (lVar10 == 0) {
        state = 0;
      }
      else {
        state = (uint64_t)*(uint *)(puVar2[0x14] + -4);
      }
      stack_depth = lVar10 >> 2;
      get_valid_actions(sch,valid_action,uVar11,uVar15,stack_depth,state);
      if (*(int *)((long)puVar2 + 0x2c4) == 2) {
        get_eager_action_cost(sch,idx,uVar15);
      }
      else if (*(int *)((long)puVar2 + 0x2c4) == 1) {
        get_hybrid_action_cost(sch,uVar11,uVar15);
      }
      uVar12 = (uint32_t)stack_depth;
      lVar10 = puVar2[0x14];
      if (puVar2[0x13] == lVar10) {
        left_label = 9999999;
      }
      else {
        left_label = *(uint32_t *)(puVar2[0xf] + (ulong)*(uint *)(lVar10 + -4) * 4);
      }
      uVar1 = *(uint *)((long)puVar2 + 0x2c4);
      if (uVar1 == 2) {
        if (n < idx) {
          right_label = *(uint32_t *)(puVar2 + 1);
        }
        else {
          right_label = *(uint32_t *)(puVar2[0xf] + uVar11 * 4);
        }
      }
      else {
        if (uVar1 != 1) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&local_1a8,"unknown transition system",0x19);
          this = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search_dep_parser.cc"
                     ,0x285,&local_2c0);
          __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        if (puVar2[0x13] == lVar10) {
          right_label = 9999999;
        }
        else {
          right_label = *(uint32_t *)(puVar2[0xf] + (ulong)*(uint *)(lVar10 + -4) * 4);
        }
      }
      if (*(char *)((long)puVar2 + 0x2c2) == '\x01') {
        if (*(char *)((long)puVar2 + 0x2c1) == '\0') {
          get_gold_actions(sch,idx,(ulong)uVar1,gold_actions);
          convert_to_onelearner_actions
                    (sch,gold_actions,(v_array<unsigned_int> *)(puVar2 + 0x2b),left_label,
                     right_label);
          uVar12 = 9999999;
          convert_to_onelearner_actions
                    (sch,valid_action,(v_array<unsigned_int> *)(puVar2 + 0x23),9999999,9999999);
          ppVar7 = Search::predictor::set_tag(&local_2a0,tag);
          ppVar7 = Search::predictor::set_input(ppVar7,(example *)*puVar2);
          ppVar7 = Search::predictor::set_oracle(ppVar7,(v_array<unsigned_int> *)(puVar2 + 0x2b));
          ppVar7 = Search::predictor::set_allowed(ppVar7,(v_array<unsigned_int> *)(puVar2 + 0x23));
          pVar4 = Search::search::get_history_length(sch);
        }
        else {
          get_cost_to_go_losses(sch,gold_action_losses,left_label,right_label);
          ppVar7 = Search::predictor::set_tag(&local_2a0,tag);
          ppVar7 = Search::predictor::set_input(ppVar7,(example *)*puVar2);
          ppVar7 = Search::predictor::set_allowed(ppVar7,gold_action_losses);
          pVar4 = Search::search::get_history_length(sch);
        }
        ppVar7 = Search::predictor::set_condition_range(ppVar7,tag - 1,pVar4,'p');
        ppVar7 = Search::predictor::set_learner_id(ppVar7,0);
        aVar5 = Search::predictor::predict(ppVar7);
        t_id = 0;
        aVar6 = 1;
        pVar4 = tag;
        if (aVar5 != 1) {
          uVar1 = *(uint *)(puVar2 + 2);
          aVar6 = 4;
          if (aVar5 != uVar1 * 2 + 2) {
            t_id = aVar5 - 1;
            aVar6 = 2;
            if (!(bool)(~(aVar5 == 0) & t_id <= uVar1)) {
              t_id = aVar5 + ~uVar1;
              aVar6 = 3;
            }
          }
        }
      }
      else {
        if (*(char *)((long)puVar2 + 0x2c1) == '\0') {
          get_gold_actions(sch,idx,(ulong)uVar1,gold_actions);
          ppVar7 = Search::predictor::set_tag(&local_2a0,tag);
          ppVar7 = Search::predictor::set_input(ppVar7,(example *)*puVar2);
          ppVar7 = Search::predictor::set_oracle(ppVar7,gold_actions);
          ppVar7 = Search::predictor::set_allowed(ppVar7,valid_action);
          pVar4 = Search::search::get_history_length(sch);
        }
        else {
          get_cost_to_go_losses(sch,gold_action_losses,left_label,right_label);
          ppVar7 = Search::predictor::set_tag(&local_2a0,tag);
          ppVar7 = Search::predictor::set_input(ppVar7,(example *)*puVar2);
          ppVar7 = Search::predictor::set_allowed(ppVar7,gold_action_losses);
          pVar4 = Search::search::get_history_length(sch);
        }
        ppVar7 = Search::predictor::set_condition_range(ppVar7,tag - 1,pVar4,'p');
        ppVar7 = Search::predictor::set_learner_id(ppVar7,0);
        aVar6 = Search::predictor::predict(ppVar7);
        uVar12 = (uint32_t)stack_depth;
        pVar4 = tag + 1;
        t_id = 0;
        if ((aVar6 != 1) && (aVar6 != 4)) {
          if ((!bVar3) && (bVar3 = Search::search::predictNeedsExample(sch), bVar3)) {
            extract_features(sch,idx,ec);
          }
          uVar12 = (uint32_t)stack_depth;
          if (*(char *)((long)puVar2 + 0x2c1) == '\x01') {
            v_array<std::pair<unsigned_int,_float>_>::clear(gold_action_losses);
            uVar12 = (uint32_t)stack_depth;
            if (*(int *)(puVar2 + 2) != 0) {
              if (aVar6 == 3) {
                right_label = left_label;
              }
              uVar14 = 1;
              do {
                local_1b8[0].first = (uint)uVar14;
                local_1b8[0].second = 1.0;
                if (right_label == uVar14) {
                  local_1b8[0].second = 0.0;
                }
                v_array<std::pair<unsigned_int,_float>_>::push_back(gold_action_losses,local_1b8);
                uVar12 = (uint32_t)stack_depth;
                bVar3 = uVar14 < *(uint *)(puVar2 + 2);
                uVar14 = uVar14 + 1;
              } while (bVar3);
            }
            ppVar7 = Search::predictor::set_tag(&local_2a0,pVar4);
            ppVar7 = Search::predictor::set_input(ppVar7,(example *)*puVar2);
            ppVar7 = Search::predictor::set_allowed(ppVar7,gold_action_losses);
            count = Search::search::get_history_length(sch);
          }
          else {
            ppVar7 = Search::predictor::set_tag(&local_2a0,pVar4);
            ppVar7 = Search::predictor::set_input(ppVar7,(example *)*puVar2);
            if (aVar6 == 3) {
              right_label = left_label;
            }
            ppVar7 = Search::predictor::set_oracle(ppVar7,right_label);
            ppVar7 = Search::predictor::erase_alloweds(ppVar7);
            count = Search::search::get_history_length(sch);
          }
          ppVar7 = Search::predictor::set_condition_range(ppVar7,tag,count,'p');
          ppVar7 = Search::predictor::set_learner_id(ppVar7,(ulong)(aVar6 - 1));
          t_id = Search::predictor::predict(ppVar7);
        }
      }
      tag = pVar4 + 1;
      if (*(int *)((long)puVar2 + 0x2c4) == 2) {
        sVar13 = transition_eager(sch,(ulong)aVar6,idx,t_id,n);
        goto LAB_0026d00f;
      }
    } while (*(int *)((long)puVar2 + 0x2c4) != 1);
    sVar13 = transition_hybrid(sch,(ulong)aVar6,idx,t_id,uVar12);
  } while( true );
}

Assistant:

void run(Search::search &sch, multi_ex &ec)
{
  task_data *data = sch.get_task_data<task_data>();
  v_array<uint32_t> &stack = data->stack, &gold_heads = data->gold_heads, &valid_actions = data->valid_actions,
                    &heads = data->heads, &gold_tags = data->gold_tags, &tags = data->tags,
                    &valid_action_temp = data->valid_action_temp;
  v_array<uint32_t> &gold_action_temp = data->gold_action_temp;
  v_array<pair<action, float>> &gold_action_losses = data->gold_action_losses;
  v_array<action> &gold_actions = data->gold_actions;
  bool &cost_to_go = data->cost_to_go, &one_learner = data->one_learner;
  uint32_t &num_label = data->num_label;
  uint32_t &sys = data->transition_system;
  uint32_t n = (uint32_t)ec.size();
  uint32_t left_label, right_label;
  stack.clear();
  stack.push_back((data->root_label == 0 && sys == arc_hybrid) ? 0 : 1);
  for (size_t i = 0; i < 6; i++)
    for (size_t j = 0; j < n + 1; j++) data->children[i][j] = 0;
  for (size_t i = 0; i < n; i++)
  {
    heads[i + 1] = my_null;
    tags[i + 1] = my_null;
  }
  ptag count = 1;
  uint32_t idx = ((data->root_label == 0 && sys == arc_hybrid) ? 1 : 2);
  Search::predictor P(sch, (ptag)0);
  while (true)
  {
    if (sys == arc_hybrid && stack.size() <= 1 && idx > n)
      break;
    else if (sys == arc_eager && stack.size() == 0 && idx > n)
      break;
    bool computedFeatures = false;
    if (sch.predictNeedsExample())
    {
      extract_features(sch, idx, ec);
      computedFeatures = true;
    }
    get_valid_actions(sch, valid_actions, idx, n, (uint64_t)stack.size(), stack.empty() ? 0 : stack.last());
    if (sys == arc_hybrid)
      get_hybrid_action_cost(sch, idx, n);
    else if (sys == arc_eager)
      get_eager_action_cost(sch, idx, n);

    // get gold tag labels
    left_label = stack.empty() ? my_null : gold_tags[stack.last()];
    if (sys == arc_hybrid)
      right_label = stack.empty() ? my_null : gold_tags[stack.last()];
    else if (sys == arc_eager)
      right_label = idx <= n ? gold_tags[idx] : (uint32_t)data->root_label;
    else
      THROW("unknown transition system");

    uint32_t a_id = 0, t_id = 0;
    if (one_learner)
    {
      if (cost_to_go)
      {
        get_cost_to_go_losses(sch, gold_action_losses, left_label, right_label);
        a_id = P.set_tag((ptag)count)
                   .set_input(*(data->ex))
                   .set_allowed(gold_action_losses)
                   .set_condition_range(count - 1, sch.get_history_length(), 'p')
                   .set_learner_id(0)
                   .predict();
      }
      else
      {
        get_gold_actions(sch, idx, n, gold_actions);
        convert_to_onelearner_actions(sch, gold_actions, gold_action_temp, left_label, right_label);
        convert_to_onelearner_actions(sch, valid_actions, valid_action_temp, my_null, my_null);
        a_id = P.set_tag((ptag)count)
                   .set_input(*(data->ex))
                   .set_oracle(gold_action_temp)
                   .set_allowed(valid_action_temp)
                   .set_condition_range(count - 1, sch.get_history_length(), 'p')
                   .set_learner_id(0)
                   .predict();
      }
      if (a_id == SHIFT)
        t_id = 0;
      else if (a_id == 2 * num_label + 2)
      {
        t_id = 0;
        a_id = REDUCE;
      }
      else if (a_id > 1 && a_id - 1 <= num_label)
      {
        t_id = a_id - 1;
        a_id = REDUCE_RIGHT;
      }
      else
      {
        t_id = (uint64_t)a_id - num_label - 1;
        a_id = REDUCE_LEFT;
      }
    }
    else
    {
      if (cost_to_go)
      {
        get_cost_to_go_losses(sch, gold_action_losses, left_label, right_label);
        a_id = P.set_tag((ptag)count)
                   .set_input(*(data->ex))
                   .set_allowed(gold_action_losses)
                   .set_condition_range(count - 1, sch.get_history_length(), 'p')
                   .set_learner_id(0)
                   .predict();
      }
      else
      {
        get_gold_actions(sch, idx, n, gold_actions);
        a_id = P.set_tag((ptag)count)
                   .set_input(*(data->ex))
                   .set_oracle(gold_actions)
                   .set_allowed(valid_actions)
                   .set_condition_range(count - 1, sch.get_history_length(), 'p')
                   .set_learner_id(0)
                   .predict();
      }

      // Predict the next action {SHIFT, REDUCE_LEFT, REDUCE_RIGHT}
      count++;

      if (a_id != SHIFT && a_id != REDUCE)
      {
        if ((!computedFeatures) && sch.predictNeedsExample())
          extract_features(sch, idx, ec);

        if (cost_to_go)
        {
          gold_action_losses.clear();
          for (size_t i = 1; i <= data->num_label; i++)
            gold_action_losses.push_back(make_pair((action)i, i != (a_id == REDUCE_LEFT ? left_label : right_label)));
          t_id = P.set_tag((ptag)count)
                     .set_input(*(data->ex))
                     .set_allowed(gold_action_losses)
                     .set_condition_range(count - 1, sch.get_history_length(), 'p')
                     .set_learner_id(a_id - 1)
                     .predict();
        }
        else
        {
          t_id = P.set_tag((ptag)count)
                     .set_input(*(data->ex))
                     .set_oracle(a_id == REDUCE_LEFT ? left_label : right_label)
                     .erase_alloweds()
                     .set_condition_range(count - 1, sch.get_history_length(), 'p')
                     .set_learner_id(a_id - 1)
                     .predict();
        }
      }
    }
    count++;
    if (sys == arc_hybrid)
      idx = (uint32_t)transition_hybrid(sch, a_id, idx, t_id, n);
    else if (sys == arc_eager)
      idx = (uint32_t)transition_eager(sch, a_id, idx, t_id, n);
  }
  if (sys == arc_hybrid)
  {
    heads[stack.last()] = 0;
    tags[stack.last()] = (uint32_t)data->root_label;
    sch.loss((gold_heads[stack.last()] != heads[stack.last()]));
  }
  if (sch.output().good())
    for (size_t i = 1; i <= n; i++) sch.output() << (heads[i]) << ":" << tags[i] << endl;
}